

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_0::CheckDecorationsCompatibility(ValidationState_t *vstate)

{
  bool bVar1;
  Op OVar2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *this;
  reference this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  Decoration *pDVar3;
  const_reference pvVar4;
  Instruction *pIVar5;
  DiagnosticStream *pDVar6;
  pair<std::_Rb_tree_const_iterator<std::tuple<spv::Decoration,_unsigned_int>_>,_bool> pVar7;
  pair<std::_Rb_tree_const_iterator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_bool>
  pVar8;
  string local_988;
  string local_968;
  DiagnosticStream local_948;
  _Self local_770;
  _Self local_768;
  undefined1 local_75c [8];
  PerMemberKey excl_k_1;
  Decoration excl_dec_type_1;
  uint32_t pair_idx_1;
  DiagnosticStream local_728;
  _Base_ptr local_550;
  byte local_548;
  _Base_ptr local_540;
  byte local_538;
  byte local_529;
  undefined1 local_528 [7];
  bool already_used_1;
  PerMemberKey k_1;
  Decoration dec_type_1;
  value_type member_id;
  value_type id_1;
  string local_4f0;
  DiagnosticStream local_4d0;
  _Self local_2f8;
  _Self local_2f0;
  tuple<spv::Decoration,_unsigned_int> local_2e4;
  PerIDKey excl_k;
  Decoration excl_dec_type;
  uint32_t pair_idx;
  DiagnosticStream local_2b0;
  _Base_ptr local_d8;
  byte local_d0;
  _Base_ptr local_c8;
  byte local_c0;
  byte local_b1;
  bool already_used;
  PerIDKey k;
  Decoration dec_type;
  value_type id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2;
  set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
  seen_per_member;
  set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
  seen_per_id;
  ValidationState_t *vstate_local;
  
  std::
  set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
  ::set((set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
         *)&seen_per_member._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
  ::set((set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
         *)&__range2);
  this = ValidationState_t::ordered_instructions(vstate);
  __end2 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
           begin(this);
  inst = (Instruction *)
         std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::end
                   (this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                *)&inst);
    if (!bVar1) {
      vstate_local._4_4_ = SPV_SUCCESS;
LAB_00286fef:
      std::
      set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
      ::~set((set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
              *)&__range2);
      std::
      set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
      ::~set((set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
              *)&seen_per_member._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return vstate_local._4_4_;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
              ::operator*(&__end2);
    this_01 = Instruction::words(this_00);
    OVar2 = Instruction::opcode(this_00);
    if (OVar2 == OpDecorate) {
      pDVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,1);
      k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
      super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = *pDVar3;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,2);
      k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.super__Tuple_impl<1UL,_unsigned_int>.
      super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
           (_Head_base<1UL,_unsigned_int,_false>)*pvVar4;
      std::tuple<spv::Decoration,_unsigned_int>::tuple<true,_true>
                ((tuple<spv::Decoration,_unsigned_int> *)&stack0xffffffffffffff50,(Decoration *)&k,
                 &k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                  super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
      pVar7 = std::
              set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
              ::insert((set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                        *)&seen_per_member._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (tuple<spv::Decoration,_unsigned_int> *)&stack0xffffffffffffff50);
      local_d8 = (_Base_ptr)pVar7.first._M_node;
      local_d0 = pVar7.second;
      local_b1 = (local_d0 ^ 0xff) & 1;
      local_c8 = local_d8;
      local_c0 = local_d0;
      if ((local_b1 != 0) &&
         (bVar1 = AtMostOncePerId((Decoration)
                                  k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                  super__Tuple_impl<1UL,_unsigned_int>.
                                  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl), bVar1))
      {
        pIVar5 = ValidationState_t::FindDef
                           (vstate,k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                   super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
        ValidationState_t::diag(&local_2b0,vstate,SPV_ERROR_INVALID_ID,pIVar5);
        pDVar6 = DiagnosticStream::operator<<(&local_2b0,(char (*) [5])"ID \'");
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,&k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                    super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [18])"\' decorated with ");
        ValidationState_t::SpvDecorationString_abi_cxx11_
                  ((string *)&pair_idx,vstate,
                   (Decoration)
                   k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                   super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
                   _M_head_impl);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&pair_idx);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [32])" multiple times is not allowed.");
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        std::__cxx11::string::~string((string *)&pair_idx);
        DiagnosticStream::~DiagnosticStream(&local_2b0);
        goto LAB_00286fef;
      }
      for (excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
           super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = DecorationRelaxedPrecision;
          excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl < Block;
          excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
               excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
               super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl + DecorationSpecId) {
        excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
        super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl
             = (_Head_base<1UL,_unsigned_int,_false>)0x7fffffff;
        if ((_Head_base<1UL,_unsigned_int,_false>)
            CheckDecorationsCompatibility::mutually_exclusive_per_id
            [excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
             super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl][0] ==
            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
            super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
            _M_head_impl) {
          excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
          super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
          _M_head_impl = (_Head_base<1UL,_unsigned_int,_false>)
                         CheckDecorationsCompatibility::mutually_exclusive_per_id
                         [excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl][1];
LAB_002869f9:
          std::tuple<spv::Decoration,_unsigned_int>::
          tuple<spv::Decoration_&,_const_unsigned_int_&,_true>
                    (&local_2e4,(Decoration *)&excl_k,
                     &k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                      super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
          local_2f0._M_node =
               (_Base_ptr)
               std::
               set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
               ::find((set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                       *)&seen_per_member._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_2e4);
          local_2f8._M_node =
               (_Base_ptr)
               std::
               set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
               ::end((set<std::tuple<spv::Decoration,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                      *)&seen_per_member._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar1 = std::operator!=(&local_2f0,&local_2f8);
          if (bVar1) {
            pIVar5 = ValidationState_t::FindDef
                               (vstate,k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                       super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
            ValidationState_t::diag(&local_4d0,vstate,SPV_ERROR_INVALID_ID,pIVar5);
            pDVar6 = DiagnosticStream::operator<<(&local_4d0,(char (*) [5])"ID \'");
            pDVar6 = DiagnosticStream::operator<<
                               (pDVar6,&k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                                        super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [23])"\' decorated with both ");
            ValidationState_t::SpvDecorationString_abi_cxx11_
                      (&local_4f0,vstate,
                       (Decoration)
                       k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                       super__Tuple_impl<1UL,_unsigned_int>.
                       super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_4f0);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [6])0x63dba9);
            ValidationState_t::SpvDecorationString_abi_cxx11_
                      ((string *)&member_id,vstate,
                       (Decoration)
                       excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                       super__Tuple_impl<1UL,_unsigned_int>.
                       super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
            pDVar6 = DiagnosticStream::operator<<
                               (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&member_id);
            pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [17])0x637818);
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            std::__cxx11::string::~string((string *)&member_id);
            std::__cxx11::string::~string((string *)&local_4f0);
            DiagnosticStream::~DiagnosticStream(&local_4d0);
            goto LAB_00286fef;
          }
        }
        else if ((_Head_base<1UL,_unsigned_int,_false>)
                 CheckDecorationsCompatibility::mutually_exclusive_per_id
                 [excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                  super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl][1] ==
                 k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                 super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
                 _M_head_impl) {
          excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
          super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
          _M_head_impl = (_Head_base<1UL,_unsigned_int,_false>)
                         CheckDecorationsCompatibility::mutually_exclusive_per_id
                         [excl_k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl][0];
          goto LAB_002869f9;
        }
      }
    }
    else {
      OVar2 = Instruction::opcode(this_00);
      if (OVar2 == OpMemberDecorate) {
        pDVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,1);
        dec_type_1 = *pDVar3;
        pDVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,2);
        k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
        super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = *pDVar3;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,3);
        k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
        super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
        super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = *pvVar4;
        std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>::tuple<true,_true>
                  ((tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)local_528,
                   &k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl,&dec_type_1,
                   &k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                    super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
        pVar8 = std::
                set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                ::insert((set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                          *)&__range2,
                         (tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)local_528);
        local_550 = (_Base_ptr)pVar8.first._M_node;
        local_548 = pVar8.second;
        local_529 = (local_548 ^ 0xff) & 1;
        local_540 = local_550;
        local_538 = local_548;
        if ((local_529 != 0) &&
           (bVar1 = AtMostOncePerMember(k_1.
                                        super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>
                                        .super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                                        super__Head_base<1UL,_unsigned_int,_false>._M_head_impl),
           bVar1)) {
          pIVar5 = ValidationState_t::FindDef(vstate,dec_type_1);
          ValidationState_t::diag(&local_728,vstate,SPV_ERROR_INVALID_ID,pIVar5);
          pDVar6 = DiagnosticStream::operator<<(&local_728,(char (*) [5])"ID \'");
          pDVar6 = DiagnosticStream::operator<<(pDVar6,&dec_type_1);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [12])"\', member \'");
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,&k_1.
                                      super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>
                                      .super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [18])"\' decorated with ");
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&excl_dec_type_1,vstate,
                     k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                     super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                     super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&excl_dec_type_1);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [32])" multiple times is not allowed.");
          vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&excl_dec_type_1);
          DiagnosticStream::~DiagnosticStream(&local_728);
          goto LAB_00286fef;
        }
        for (excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
             super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = DecorationRelaxedPrecision
            ; excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
              super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl ==
              DecorationRelaxedPrecision;
            excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
            super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                 excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                 super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl + DecorationSpecId) {
          excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
          super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0x7fffffff;
          if (k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
              super__Head_base<1UL,_unsigned_int,_false>._M_head_impl == DecorationRowMajor) {
            excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
            super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = ColMajor;
LAB_00286e13:
            std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>::
            tuple<spv::Decoration_&,_const_unsigned_int_&,_const_unsigned_int_&,_true,_true>
                      ((tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)local_75c,
                       &excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>
                        .super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                        super__Head_base<1UL,_unsigned_int,_false>._M_head_impl,&dec_type_1,
                       &k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                        super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl);
            local_768._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                 ::find((set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                         *)&__range2,(key_type *)local_75c);
            local_770._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                 ::end((set<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                        *)&__range2);
            bVar1 = std::operator!=(&local_768,&local_770);
            if (bVar1) {
              pIVar5 = ValidationState_t::FindDef(vstate,dec_type_1);
              ValidationState_t::diag(&local_948,vstate,SPV_ERROR_INVALID_ID,pIVar5);
              pDVar6 = DiagnosticStream::operator<<(&local_948,(char (*) [5])"ID \'");
              pDVar6 = DiagnosticStream::operator<<(pDVar6,&dec_type_1);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [12])"\', member \'");
              pDVar6 = DiagnosticStream::operator<<
                                 (pDVar6,&k_1.
                                          super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>
                                          .super__Head_base<0UL,_spv::Decoration,_false>.
                                          _M_head_impl);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [23])"\' decorated with both ")
              ;
              ValidationState_t::SpvDecorationString_abi_cxx11_
                        (&local_968,vstate,
                         k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                         super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                         super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_968);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [6])0x63dba9);
              ValidationState_t::SpvDecorationString_abi_cxx11_
                        (&local_988,vstate,
                         excl_k_1.
                         super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                         super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                         super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_988);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [17])0x637818);
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              std::__cxx11::string::~string((string *)&local_988);
              std::__cxx11::string::~string((string *)&local_968);
              DiagnosticStream::~DiagnosticStream(&local_948);
              goto LAB_00286fef;
            }
          }
          else if (k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
                   super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                   super__Head_base<1UL,_unsigned_int,_false>._M_head_impl == ColMajor) {
            excl_k_1.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int,_unsigned_int>.
            super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = DecorationRowMajor;
            goto LAB_00286e13;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t CheckDecorationsCompatibility(ValidationState_t& vstate) {
  using PerIDKey = std::tuple<spv::Decoration, uint32_t>;
  using PerMemberKey = std::tuple<spv::Decoration, uint32_t, uint32_t>;

  // An Array of pairs where the decorations in the pair cannot both be applied
  // to the same id.
  static const spv::Decoration mutually_exclusive_per_id[][2] = {
      {spv::Decoration::Block, spv::Decoration::BufferBlock},
      {spv::Decoration::Restrict, spv::Decoration::Aliased}};
  static const auto num_mutually_exclusive_per_id_pairs =
      sizeof(mutually_exclusive_per_id) / (2 * sizeof(spv::Decoration));

  // An Array of pairs where the decorations in the pair cannot both be applied
  // to the same member.
  static const spv::Decoration mutually_exclusive_per_member[][2] = {
      {spv::Decoration::RowMajor, spv::Decoration::ColMajor}};
  static const auto num_mutually_exclusive_per_mem_pairs =
      sizeof(mutually_exclusive_per_member) / (2 * sizeof(spv::Decoration));

  std::set<PerIDKey> seen_per_id;
  std::set<PerMemberKey> seen_per_member;

  for (const auto& inst : vstate.ordered_instructions()) {
    const auto& words = inst.words();
    if (spv::Op::OpDecorate == inst.opcode()) {
      const auto id = words[1];
      const auto dec_type = static_cast<spv::Decoration>(words[2]);
      const auto k = PerIDKey(dec_type, id);
      const auto already_used = !seen_per_id.insert(k).second;
      if (already_used && AtMostOncePerId(dec_type)) {
        return vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(id))
               << "ID '" << id << "' decorated with "
               << vstate.SpvDecorationString(dec_type)
               << " multiple times is not allowed.";
      }
      // Verify certain mutually exclusive decorations are not both applied on
      // an ID.
      for (uint32_t pair_idx = 0;
           pair_idx < num_mutually_exclusive_per_id_pairs; ++pair_idx) {
        spv::Decoration excl_dec_type = spv::Decoration::Max;
        if (mutually_exclusive_per_id[pair_idx][0] == dec_type) {
          excl_dec_type = mutually_exclusive_per_id[pair_idx][1];
        } else if (mutually_exclusive_per_id[pair_idx][1] == dec_type) {
          excl_dec_type = mutually_exclusive_per_id[pair_idx][0];
        } else {
          continue;
        }

        const auto excl_k = PerIDKey(excl_dec_type, id);
        if (seen_per_id.find(excl_k) != seen_per_id.end()) {
          return vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(id))
                 << "ID '" << id << "' decorated with both "
                 << vstate.SpvDecorationString(dec_type) << " and "
                 << vstate.SpvDecorationString(excl_dec_type)
                 << " is not allowed.";
        }
      }
    } else if (spv::Op::OpMemberDecorate == inst.opcode()) {
      const auto id = words[1];
      const auto member_id = words[2];
      const auto dec_type = static_cast<spv::Decoration>(words[3]);
      const auto k = PerMemberKey(dec_type, id, member_id);
      const auto already_used = !seen_per_member.insert(k).second;
      if (already_used && AtMostOncePerMember(dec_type)) {
        return vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(id))
               << "ID '" << id << "', member '" << member_id
               << "' decorated with " << vstate.SpvDecorationString(dec_type)
               << " multiple times is not allowed.";
      }
      // Verify certain mutually exclusive decorations are not both applied on
      // a (ID, member) tuple.
      for (uint32_t pair_idx = 0;
           pair_idx < num_mutually_exclusive_per_mem_pairs; ++pair_idx) {
        spv::Decoration excl_dec_type = spv::Decoration::Max;
        if (mutually_exclusive_per_member[pair_idx][0] == dec_type) {
          excl_dec_type = mutually_exclusive_per_member[pair_idx][1];
        } else if (mutually_exclusive_per_member[pair_idx][1] == dec_type) {
          excl_dec_type = mutually_exclusive_per_member[pair_idx][0];
        } else {
          continue;
        }

        const auto excl_k = PerMemberKey(excl_dec_type, id, member_id);
        if (seen_per_member.find(excl_k) != seen_per_member.end()) {
          return vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(id))
                 << "ID '" << id << "', member '" << member_id
                 << "' decorated with both "
                 << vstate.SpvDecorationString(dec_type) << " and "
                 << vstate.SpvDecorationString(excl_dec_type)
                 << " is not allowed.";
        }
      }
    }
  }
  return SPV_SUCCESS;
}